

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTableDrivenParser.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  basic_streambuf<char,_std::char_traits<char>_> *cinBuf;
  ifstream fin;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    parse();
  }
  else {
    for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
      std::ifstream::ifstream(&cinBuf,argv[local_1c],_S_in);
      lVar1 = *(long *)(std::cin + -0x18);
      std::ifstream::rdbuf();
      std::ios::rdbuf((streambuf *)((long)&std::cin + lVar1));
      parse();
      std::ifstream::close();
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      std::ifstream::~ifstream(&cinBuf);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        parse();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            parse();
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}